

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall glslang::TIntermediate::inOutLocationCheck(TIntermediate *this,TInfoSink *infoSink)

{
  int iVar1;
  TIntermAggregate *pTVar2;
  undefined4 extraout_var;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  long lVar3;
  
  pTVar2 = findLinkerObjects(this);
  iVar1 = (*(pTVar2->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x32])(pTVar2);
  lVar3 = CONCAT44(extraout_var,iVar1);
  lVar5 = *(long *)(lVar3 + 8);
  uVar7 = 0;
  if (*(long *)(lVar3 + 0x10) == lVar5) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    uVar6 = 0;
    do {
      plVar4 = (long *)(**(code **)(**(long **)(lVar5 + uVar6 * 8) + 0x18))();
      plVar4 = (long *)(**(code **)(*plVar4 + 0xf0))(plVar4);
      lVar5 = (**(code **)(*plVar4 + 0x58))(plVar4);
      if ((this->language == EShLangFragment) && (*(short *)(lVar5 + 8) == 4)) {
        uVar7 = uVar7 + 1;
        if ((*(ulong *)(lVar5 + 0x1c) & 0xff000000007fff) == 0xff000000004fff) {
          bVar8 = true;
        }
      }
      uVar6 = uVar6 + 1;
      lVar5 = *(long *)(lVar3 + 8);
    } while (uVar6 < (ulong)(*(long *)(lVar3 + 0x10) - lVar5 >> 3));
    uVar7 = (uint)(1 < (int)uVar7);
  }
  if (((this->profile == EEsProfile) && ((char)uVar7 != '\0')) && (bVar8)) {
    error(this,infoSink,
          "when more than one fragment shader output, all must have location qualifiers",
          EShLangCount);
    return;
  }
  return;
}

Assistant:

void TIntermediate::inOutLocationCheck(TInfoSink& infoSink)
{
    // ES 3.0 requires all outputs to have location qualifiers if there is more than one output
    bool fragOutWithNoLocation = false;
    int numFragOut = 0;

    // TODO: linker functionality: location collision checking

    TIntermSequence& linkObjects = findLinkerObjects()->getSequence();
    for (size_t i = 0; i < linkObjects.size(); ++i) {
        const TType& type = linkObjects[i]->getAsTyped()->getType();
        const TQualifier& qualifier = type.getQualifier();
        if (language == EShLangFragment) {
            if (qualifier.storage == EvqVaryingOut && qualifier.builtIn == EbvNone) {
                ++numFragOut;
                if (!qualifier.hasAnyLocation())
                    fragOutWithNoLocation = true;
            }
        }
    }

    if (isEsProfile()) {
        if (numFragOut > 1 && fragOutWithNoLocation)
            error(infoSink, "when more than one fragment shader output, all must have location qualifiers");
    }
}